

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O2

int run_test_spawn_setuid_setgid(void)

{
  __uid_t _Var1;
  int iVar2;
  passwd *ppVar3;
  undefined8 uVar4;
  uv_loop_t *loop;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  int64_t eval_b;
  int64_t eval_a;
  char gidstr [10];
  char uidstr [10];
  
  _Var1 = getuid();
  if (_Var1 != 0) {
    pcVar5 = "It should be run as root user";
LAB_0017ad38:
    fprintf(_stderr,"%s\n",pcVar5);
    fflush(_stderr);
    return 7;
  }
  init_process_options("spawn_helper_setuid_setgid",exit_cb);
  ppVar3 = getpwnam("nobody");
  if (ppVar3 == (passwd *)0x0) {
    pcVar7 = "!=";
    eval_b = 0;
    pcVar9 = "!=";
    eval_a = 0;
    pcVar8 = "NULL";
    pcVar5 = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
    pcVar6 = "pw";
    uVar4 = 0x5c2;
  }
  else {
    options.uid = ppVar3->pw_uid;
    options.gid = ppVar3->pw_gid;
    snprintf(uidstr,10,"%d",(ulong)ppVar3->pw_uid);
    snprintf(gidstr,10,"%d",(ulong)ppVar3->pw_gid);
    options.args[2] = uidstr;
    options.args[3] = gidstr;
    options.flags = 3;
    uVar4 = uv_default_loop();
    iVar2 = uv_spawn(uVar4,&process,&options);
    if (iVar2 == -0xd) {
      pcVar5 = "user \'nobody\' cannot access the test runner";
      goto LAB_0017ad38;
    }
    eval_a = (int64_t)iVar2;
    eval_b = 0;
    if (eval_a == 0) {
      uVar4 = uv_default_loop();
      iVar2 = uv_run(uVar4,0);
      eval_a = (int64_t)iVar2;
      eval_b = 0;
      if (eval_a == 0) {
        eval_a = 1;
        eval_b = (int64_t)exit_cb_called;
        if (eval_b == 1) {
          eval_a = 1;
          eval_b = (int64_t)close_cb_called;
          if (eval_b == 1) {
            loop = (uv_loop_t *)uv_default_loop();
            close_loop(loop);
            eval_a = 0;
            uVar4 = uv_default_loop();
            iVar2 = uv_loop_close(uVar4);
            eval_b = (int64_t)iVar2;
            if (eval_b == 0) {
              uv_library_shutdown();
              return 0;
            }
            pcVar8 = "uv_loop_close(uv_default_loop())";
            pcVar6 = "0";
            uVar4 = 0x5d7;
          }
          else {
            pcVar8 = "close_cb_called";
            pcVar6 = "1";
            uVar4 = 0x5d5;
          }
        }
        else {
          pcVar8 = "exit_cb_called";
          pcVar6 = "1";
          uVar4 = 0x5d4;
        }
      }
      else {
        pcVar8 = "0";
        pcVar6 = "r";
        uVar4 = 0x5d2;
      }
    }
    else {
      pcVar8 = "0";
      pcVar6 = "r";
      uVar4 = 0x5cf;
    }
    pcVar7 = "==";
    pcVar5 = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
    pcVar9 = "==";
  }
  fprintf(_stderr,pcVar5,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
          ,uVar4,pcVar6,pcVar7,pcVar8,eval_a,pcVar9,eval_b);
  abort();
}

Assistant:

TEST_IMPL(spawn_setuid_setgid) {
  int r;
  struct passwd* pw;
  char uidstr[10];
  char gidstr[10];

  /* if not root, then this will fail. */
  uv_uid_t uid = getuid();
  if (uid != 0) {
    RETURN_SKIP("It should be run as root user");
  }

  init_process_options("spawn_helper_setuid_setgid", exit_cb);

  /* become the "nobody" user. */
  pw = getpwnam("nobody");
  ASSERT_NOT_NULL(pw);
  options.uid = pw->pw_uid;
  options.gid = pw->pw_gid;
  snprintf(uidstr, sizeof(uidstr), "%d", pw->pw_uid);
  snprintf(gidstr, sizeof(gidstr), "%d", pw->pw_gid);
  options.args[2] = uidstr;
  options.args[3] = gidstr;
  options.flags = UV_PROCESS_SETUID | UV_PROCESS_SETGID;

  r = uv_spawn(uv_default_loop(), &process, &options);
  if (r == UV_EACCES)
    RETURN_SKIP("user 'nobody' cannot access the test runner");

  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}